

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

Generators<unary_op_tuple<trng::optimized_impl::uint128,_long_double>_> *
Catch::Generators::
makeGenerators<unary_op_tuple<trng::optimized_impl::uint128,long_double>,unary_op_tuple<trng::optimized_impl::uint128,long_double>,unary_op_tuple<trng::optimized_impl::uint128,long_double>,unary_op_tuple<trng::optimized_impl::uint128,long_double>>
          (unary_op_tuple<trng::optimized_impl::uint128,_long_double> *val,
          unary_op_tuple<trng::optimized_impl::uint128,_long_double> *moreGenerators,
          unary_op_tuple<trng::optimized_impl::uint128,_long_double> *moreGenerators_1,
          unary_op_tuple<trng::optimized_impl::uint128,_long_double> *moreGenerators_2)

{
  unary_op_tuple<trng::optimized_impl::uint128,_long_double> *in_RDX;
  Generators<unary_op_tuple<trng::optimized_impl::uint128,_long_double>_> *in_RDI;
  Generators<unary_op_tuple<trng::optimized_impl::uint128,_long_double>_> *moreGenerators_2_00;
  unary_op_tuple<trng::optimized_impl::uint128,_long_double> *moreGenerators_1_00;
  unary_op_tuple<trng::optimized_impl::uint128,_long_double> *in_stack_ffffffffffffffc0;
  GeneratorWrapper<unary_op_tuple<trng::optimized_impl::uint128,_long_double>_>
  *in_stack_ffffffffffffffc8;
  
  moreGenerators_1_00 =
       (unary_op_tuple<trng::optimized_impl::uint128,_long_double> *)&stack0xffffffffffffffd0;
  moreGenerators_2_00 = in_RDI;
  value<unary_op_tuple<trng::optimized_impl::uint128,long_double>>(in_RDX);
  makeGenerators<unary_op_tuple<trng::optimized_impl::uint128,long_double>,unary_op_tuple<trng::optimized_impl::uint128,long_double>,unary_op_tuple<trng::optimized_impl::uint128,long_double>,unary_op_tuple<trng::optimized_impl::uint128,long_double>>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,moreGenerators_1_00,
             (unary_op_tuple<trng::optimized_impl::uint128,_long_double> *)moreGenerators_2_00);
  GeneratorWrapper<unary_op_tuple<trng::optimized_impl::uint128,_long_double>_>::~GeneratorWrapper
            ((GeneratorWrapper<unary_op_tuple<trng::optimized_impl::uint128,_long_double>_> *)
             0x43ad87);
  return in_RDI;
}

Assistant:

auto makeGenerators( T&& val, Gs &&... moreGenerators ) -> Generators<T> {
        return makeGenerators( value( std::forward<T>( val ) ), std::forward<Gs>( moreGenerators )... );
    }